

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

Var Js::JavascriptBigInt::Sub(Var aLeft,Var aRight)

{
  JavascriptBigInt *pJVar1;
  JavascriptBigInt *pJVar2;
  ScriptContext *pSVar3;
  JavascriptBigInt *rightBigInt;
  JavascriptBigInt *leftBigInt;
  Var aRight_local;
  Var aLeft_local;
  
  pJVar1 = VarTo<Js::JavascriptBigInt>(aLeft);
  pJVar2 = VarTo<Js::JavascriptBigInt>(aRight);
  pSVar3 = RecyclableObject::GetScriptContext(&pJVar1->super_RecyclableObject);
  pJVar1 = New(pJVar1,pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(&pJVar2->super_RecyclableObject);
  pJVar2 = New(pJVar2,pSVar3);
  pJVar1 = Sub(pJVar1,pJVar2);
  return pJVar1;
}

Assistant:

Var JavascriptBigInt::Sub(Var aLeft, Var aRight)
    {
        JavascriptBigInt *leftBigInt = VarTo<JavascriptBigInt>(aLeft);
        JavascriptBigInt *rightBigInt = VarTo<JavascriptBigInt>(aRight);
        return JavascriptBigInt::Sub(JavascriptBigInt::New(leftBigInt, leftBigInt->GetScriptContext()), JavascriptBigInt::New(rightBigInt, rightBigInt->GetScriptContext()));
        // TODO: Consider deferring creation of new instances until we need them
    }